

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctred.c
# Opt level: O2

void jpeg_idct_4x4(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  short sVar1;
  JSAMPLE *pJVar2;
  void *pvVar3;
  JSAMPLE JVar4;
  long lVar5;
  short sVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  JSAMPLE *pJVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  int aiStack_d4 [7];
  int aiStack_b8 [16];
  int local_78 [8];
  undefined4 auStack_58 [10];
  
  pJVar2 = cinfo->sample_range_limit;
  pvVar3 = compptr->dct_table;
  iVar8 = 8;
  lVar10 = 0;
  do {
    if (iVar8 != 4) {
      if (iVar8 == 0) break;
      sVar1 = *(short *)((long)coef_block + lVar10 + 0x10);
      sVar6 = *(short *)((long)coef_block + lVar10 + 0x20);
      if (sVar6 == 0 && sVar1 == 0) {
        if (((*(short *)((long)coef_block + lVar10 + 0x30) != 0) ||
            (*(short *)((long)coef_block + lVar10 + 0x50) != 0)) ||
           ((*(short *)((long)coef_block + lVar10 + 0x60) != 0 ||
            (*(short *)((long)coef_block + lVar10 + 0x70) != 0)))) {
          sVar6 = 0;
          goto LAB_0014384f;
        }
        iVar16 = (int)*(short *)((long)pvVar3 + lVar10) * (int)*(short *)((long)coef_block + lVar10)
                 * 4;
        *(int *)((long)aiStack_d4 + lVar10 * 2 + 0x1c) = iVar16;
        *(int *)((long)local_78 + lVar10 * 2 + -0x20) = iVar16;
        *(int *)((long)local_78 + lVar10 * 2) = iVar16;
        lVar5 = 0x60;
      }
      else {
LAB_0014384f:
        lVar14 = (long)*(short *)((long)pvVar3 + lVar10) *
                 (long)*(short *)((long)coef_block + lVar10) * 0x4000;
        lVar15 = (long)*(short *)((long)pvVar3 + lVar10 + 0x60) *
                 (long)*(short *)((long)coef_block + lVar10 + 0x60) * -0x187e +
                 (long)*(short *)((long)pvVar3 + lVar10 + 0x20) * (long)sVar6 * 0x3b21;
        lVar18 = lVar14 - lVar15;
        lVar11 = (long)*(short *)((long)pvVar3 + lVar10 + 0x70) *
                 (long)*(short *)((long)coef_block + lVar10 + 0x70);
        lVar5 = (long)*(short *)((long)pvVar3 + lVar10 + 0x50) *
                (long)*(short *)((long)coef_block + lVar10 + 0x50);
        lVar9 = (long)*(short *)((long)pvVar3 + lVar10 + 0x30) *
                (long)*(short *)((long)coef_block + lVar10 + 0x30);
        lVar7 = (long)*(short *)((long)pvVar3 + lVar10 + 0x10) * (long)sVar1;
        lVar19 = lVar7 * 0x21f9 + lVar9 * -0x4587 + lVar5 * 0x2e75 + lVar11 * -0x6c2;
        lVar5 = lVar7 * 0x5203 + lVar9 * 0x1ccd + lVar5 * -0x133e + lVar11 * -0x1050;
        lVar15 = lVar14 + 0x800 + lVar15;
        *(int *)((long)aiStack_d4 + lVar10 * 2 + 0x1c) = (int)((ulong)(lVar15 + lVar5) >> 0xc);
        *(int *)((long)auStack_58 + lVar10 * 2) = (int)((ulong)(lVar15 - lVar5) >> 0xc);
        *(int *)((long)local_78 + lVar10 * 2 + -0x20) = (int)(lVar18 + lVar19 + 0x800U >> 0xc);
        iVar16 = (int)((ulong)((lVar18 + 0x800) - lVar19) >> 0xc);
        lVar5 = 0x40;
      }
      *(int *)((long)aiStack_d4 + lVar10 * 2 + lVar5 + 0x1c) = iVar16;
    }
    iVar8 = iVar8 + -1;
    lVar10 = lVar10 + 2;
  } while( true );
  lVar10 = 7;
  do {
    if (lVar10 == 0x27) {
      return;
    }
    pJVar12 = (JSAMPLE *)(*(long *)((long)output_buf + lVar10 + -7) + (ulong)output_col);
    iVar8 = aiStack_d4[lVar10 + 1];
    iVar16 = aiStack_d4[lVar10 + 2];
    if (aiStack_d4[lVar10 + 2] == 0 && iVar8 == 0) {
      iVar16 = 0;
      if ((((aiStack_d4[lVar10 + 3] != 0) || (aiStack_d4[lVar10 + 5] != 0)) ||
          (iVar16 = 0, aiStack_d4[lVar10 + 6] != 0)) || (aiStack_d4[lVar10 + 7] != 0))
      goto LAB_00143a1c;
      JVar4 = pJVar2[(ulong)(aiStack_d4[lVar10] + 0x10U >> 5 & 0x3ff) + 0x80];
      *pJVar12 = JVar4;
      pJVar12[1] = JVar4;
      pJVar12[2] = JVar4;
      lVar5 = 3;
    }
    else {
LAB_00143a1c:
      iVar16 = aiStack_d4[lVar10 + 6] * -0x187e + iVar16 * 0x3b21;
      iVar17 = iVar8 * 0x21f9 + aiStack_d4[lVar10 + 7] * -0x6c2 +
               aiStack_d4[lVar10 + 3] * -0x4587 + aiStack_d4[lVar10 + 5] * 0x2e75;
      iVar13 = iVar8 * 0x5203 + aiStack_d4[lVar10 + 7] * -0x1050 +
               aiStack_d4[lVar10 + 3] * 0x1ccd + aiStack_d4[lVar10 + 5] * -0x133e;
      iVar8 = aiStack_d4[lVar10] * 0x4000 - iVar16;
      iVar16 = aiStack_d4[lVar10] * 0x4000 + 0x40000 + iVar16;
      *pJVar12 = pJVar2[(ulong)((uint)(iVar16 + iVar13) >> 0x13 & 0x3ff) + 0x80];
      pJVar12[3] = pJVar2[(ulong)((uint)(iVar16 - iVar13) >> 0x13 & 0x3ff) + 0x80];
      pJVar12[1] = pJVar2[(ulong)(iVar8 + iVar17 + 0x40000U >> 0x13 & 0x3ff) + 0x80];
      JVar4 = pJVar2[(ulong)((uint)((iVar8 + 0x40000) - iVar17) >> 0x13 & 0x3ff) + 0x80];
      lVar5 = 2;
    }
    pJVar12[lVar5] = JVar4;
    lVar10 = lVar10 + 8;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_idct_4x4(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  JLONG tmp0, tmp2, tmp10, tmp12;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE * 4];   /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; inptr++, quantptr++, wsptr++, ctr--) {
    /* Don't bother to process column 4, because second pass won't use it */
    if (ctr == DCTSIZE - 4)
      continue;
    if (inptr[DCTSIZE * 1] == 0 && inptr[DCTSIZE * 2] == 0 &&
        inptr[DCTSIZE * 3] == 0 && inptr[DCTSIZE * 5] == 0 &&
        inptr[DCTSIZE * 6] == 0 && inptr[DCTSIZE * 7] == 0) {
      /* AC terms all zero; we need not examine term 4 for 4x4 output */
      int dcval = LEFT_SHIFT(DEQUANTIZE(inptr[DCTSIZE * 0],
                                        quantptr[DCTSIZE * 0]), PASS1_BITS);

      wsptr[DCTSIZE * 0] = dcval;
      wsptr[DCTSIZE * 1] = dcval;
      wsptr[DCTSIZE * 2] = dcval;
      wsptr[DCTSIZE * 3] = dcval;

      continue;
    }

    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS + 1);

    z2 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp2 = MULTIPLY(z2, FIX_1_847759065) + MULTIPLY(z3, -FIX_0_765366865);

    tmp10 = tmp0 + tmp2;
    tmp12 = tmp0 - tmp2;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);

    tmp0 = MULTIPLY(z1, -FIX_0_211164243) + /* sqrt(2) * ( c3-c1) */
           MULTIPLY(z2,  FIX_1_451774981) + /* sqrt(2) * ( c3+c7) */
           MULTIPLY(z3, -FIX_2_172734803) + /* sqrt(2) * (-c1-c5) */
           MULTIPLY(z4,  FIX_1_061594337);  /* sqrt(2) * ( c5+c7) */

    tmp2 = MULTIPLY(z1, -FIX_0_509795579) + /* sqrt(2) * (c7-c5) */
           MULTIPLY(z2, -FIX_0_601344887) + /* sqrt(2) * (c5-c1) */
           MULTIPLY(z3,  FIX_0_899976223) + /* sqrt(2) * (c3-c7) */
           MULTIPLY(z4,  FIX_2_562915447);  /* sqrt(2) * (c1+c3) */

    /* Final output stage */

    wsptr[DCTSIZE * 0] =
      (int)DESCALE(tmp10 + tmp2, CONST_BITS - PASS1_BITS + 1);
    wsptr[DCTSIZE * 3] =
      (int)DESCALE(tmp10 - tmp2, CONST_BITS - PASS1_BITS + 1);
    wsptr[DCTSIZE * 1] =
      (int)DESCALE(tmp12 + tmp0, CONST_BITS - PASS1_BITS + 1);
    wsptr[DCTSIZE * 2] =
      (int)DESCALE(tmp12 - tmp0, CONST_BITS - PASS1_BITS + 1);
  }

  /* Pass 2: process 4 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 4; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* It's not clear whether a zero row test is worthwhile here ... */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[2] == 0 && wsptr[3] == 0 &&
        wsptr[5] == 0 && wsptr[6] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[(int)DESCALE((JLONG)wsptr[0],
                                               PASS1_BITS + 3) & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;
      outptr[2] = dcval;
      outptr[3] = dcval;

      wsptr += DCTSIZE;         /* advance pointer to next row */
      continue;
    }
#endif

    /* Even part */

    tmp0 = LEFT_SHIFT((JLONG)wsptr[0], CONST_BITS + 1);

    tmp2 = MULTIPLY((JLONG)wsptr[2],  FIX_1_847759065) +
           MULTIPLY((JLONG)wsptr[6], -FIX_0_765366865);

    tmp10 = tmp0 + tmp2;
    tmp12 = tmp0 - tmp2;

    /* Odd part */

    z1 = (JLONG)wsptr[7];
    z2 = (JLONG)wsptr[5];
    z3 = (JLONG)wsptr[3];
    z4 = (JLONG)wsptr[1];

    tmp0 = MULTIPLY(z1, -FIX_0_211164243) + /* sqrt(2) * ( c3-c1) */
           MULTIPLY(z2,  FIX_1_451774981) + /* sqrt(2) * ( c3+c7) */
           MULTIPLY(z3, -FIX_2_172734803) + /* sqrt(2) * (-c1-c5) */
           MULTIPLY(z4,  FIX_1_061594337);  /* sqrt(2) * ( c5+c7) */

    tmp2 = MULTIPLY(z1, -FIX_0_509795579) + /* sqrt(2) * (c7-c5) */
           MULTIPLY(z2, -FIX_0_601344887) + /* sqrt(2) * (c5-c1) */
           MULTIPLY(z3, FIX_0_899976223) +  /* sqrt(2) * (c3-c7) */
           MULTIPLY(z4, FIX_2_562915447);   /* sqrt(2) * (c1+c3) */

    /* Final output stage */

    outptr[0] = range_limit[(int)DESCALE(tmp10 + tmp2,
                                         CONST_BITS + PASS1_BITS + 3 + 1) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)DESCALE(tmp10 - tmp2,
                                         CONST_BITS + PASS1_BITS + 3 + 1) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)DESCALE(tmp12 + tmp0,
                                         CONST_BITS + PASS1_BITS + 3 + 1) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)DESCALE(tmp12 - tmp0,
                                         CONST_BITS + PASS1_BITS + 3 + 1) &
                            RANGE_MASK];

    wsptr += DCTSIZE;           /* advance pointer to next row */
  }
}